

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O2

void __thiscall
chrono::ChArchiveOut::out<std::shared_ptr<chrono::ChForce>>
          (ChArchiveOut *this,
          ChNameValue<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
          *bVal)

{
  long lVar1;
  size_t i;
  ulong uVar2;
  ChValueSpecific<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  specVal;
  char buffer [20];
  ChNameValue<std::shared_ptr<chrono::ChForce>_> local_98;
  ChValueSpecific<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  local_80;
  char local_48 [24];
  
  ChValueSpecific<std::vector<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>_>
  ::ChValueSpecific(&local_80,bVal->_value,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xe])
            (this,&local_80,
             (long)(bVal->_value->
                   super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(bVal->_value->
                   super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 4);
  lVar1 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(bVal->_value->
                            super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish -
                      (long)(bVal->_value->
                            super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                            )._M_impl.super__Vector_impl_data._M_start >> 4); uVar2 = uVar2 + 1) {
    sprintf(local_48,"%lu",uVar2);
    local_98._value =
         (shared_ptr<chrono::ChForce> *)
         ((long)&(((bVal->_value->
                   super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                   )._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chrono::ChForce,_(__gnu_cxx::_Lock_policy)2>)._M_ptr + lVar1);
    local_98._flags = '\0';
    local_98._name = local_48;
    out<chrono::ChForce>(this,&local_98);
    (*(this->super_ChArchive)._vptr_ChArchive[0xf])
              (this,&local_80,
               (long)(bVal->_value->
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(bVal->_value->
                     super__Vector_base<std::shared_ptr<chrono::ChForce>,_std::allocator<std::shared_ptr<chrono::ChForce>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 4);
    lVar1 = lVar1 + 0x10;
  }
  (*(this->super_ChArchive)._vptr_ChArchive[0x10])(this,&local_80);
  ChValue::~ChValue(&local_80.super_ChValue);
  return;
}

Assistant:

void out     (ChNameValue< std::vector<T> > bVal) {
          ChValueSpecific< std::vector<T> > specVal(bVal.value(), bVal.name(), bVal.flags());
          this->out_array_pre( specVal, bVal.value().size());
          for (size_t i = 0; i<bVal.value().size(); ++i)
          {
              char buffer[20];
              sprintf(buffer, "%lu", (unsigned long)i);
              ChNameValue< T > array_val(buffer, bVal.value()[i]);
              this->out (array_val);
              this->out_array_between(specVal, bVal.value().size());
          }
          this->out_array_end(specVal, bVal.value().size());
      }